

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Obj_t * Gia_ManFraigMarkAnd(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  undefined8 uVar3;
  
  uVar3 = *(undefined8 *)pObj;
  if ((-1 < (int)(uint)uVar3) && (((uint)uVar3 & 0x1fffffff) != 0x1fffffff)) {
    while ((-1 < (int)(uint)uVar3 && (((uint)uVar3 & 0x1fffffff) != 0x1fffffff))) {
      iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
      if (iVar2 != 0) {
        Gia_ObjSetTravIdCurrent(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
        Gia_ObjSetTravIdCurrent(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
      }
      pGVar1 = pObj + -1;
      pObj = pObj + -1;
      uVar3 = *(undefined8 *)pGVar1;
    }
    return pObj;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                ,0xf7,"Gia_Obj_t *Gia_ManFraigMarkAnd(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Obj_t * Gia_ManFraigMarkAnd( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsAnd(pObj) ); Gia_ObjIsAnd(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        {
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin0(pObj) );
            Gia_ObjSetTravIdCurrent( p, Gia_ObjFanin1(pObj) );
        }
    return pObj;
}